

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O3

char * google::protobuf::FastInt64ToBufferLeft(int64 i,char *buffer)

{
  LogMessage *other;
  char *pcVar1;
  uint uVar2;
  uint uVar3;
  LogFinisher LStack_51;
  LogMessage LStack_50;
  
  if (i < 0) {
    *buffer = '-';
    pcVar1 = FastUInt64ToBufferLeft(-i,buffer + 1);
    return pcVar1;
  }
  if ((ulong)i >> 0x20 == 0) {
    pcVar1 = FastUInt32ToBufferLeft((uint32)i,buffer);
    return pcVar1;
  }
  pcVar1 = FastUInt64ToBufferLeft((ulong)i / 1000000000,buffer);
  uVar3 = (uint32)i + (int)((ulong)i / 1000000000) * -1000000000;
  if (999999999 < uVar3) {
    internal::LogMessage::LogMessage
              (&LStack_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
               ,0x42c);
    other = internal::LogMessage::operator<<(&LStack_50,"CHECK failed: (digits) < (100): ");
    internal::LogFinisher::operator=(&LStack_51,other);
    internal::LogMessage::~LogMessage(&LStack_50);
  }
  *(undefined2 *)pcVar1 = *(undefined2 *)(two_ASCII_digits + (ulong)(uVar3 / 10000000) * 2);
  uVar2 = uVar3 % 10000000 >> 5;
  *(undefined2 *)(pcVar1 + 2) = *(undefined2 *)(two_ASCII_digits + ((ulong)uVar2 / 0xc35) * 2);
  uVar3 = (uVar2 / 0xc35) * -100000 + uVar3 % 10000000;
  *(undefined2 *)(pcVar1 + 4) = *(undefined2 *)(two_ASCII_digits + ((ulong)uVar3 / 1000) * 2);
  uVar3 = uVar3 % 1000;
  *(undefined2 *)(pcVar1 + 6) = *(undefined2 *)(two_ASCII_digits + ((ulong)uVar3 / 10) * 2);
  pcVar1[8] = (char)(uVar3 / 10) * -10 + (char)uVar3 + '0';
  pcVar1[9] = '\0';
  return pcVar1 + 9;
}

Assistant:

char* FastInt64ToBufferLeft(int64 i, char* buffer) {
  uint64 u = 0;
  if (i < 0) {
    *buffer++ = '-';
    u -= i;
  } else {
    u = i;
  }
  return FastUInt64ToBufferLeft(u, buffer);
}